

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_stream.cpp
# Opt level: O0

void __thiscall
create::SerialStream::SerialStream
          (SerialStream *this,shared_ptr<create::Data> *d,uint8_t *header,
          bool install_signal_handler)

{
  shared_ptr<create::Data> local_38;
  byte local_21;
  uint8_t *puStack_20;
  bool install_signal_handler_local;
  uint8_t *header_local;
  shared_ptr<create::Data> *d_local;
  SerialStream *this_local;
  
  local_21 = install_signal_handler;
  puStack_20 = header;
  header_local = (uint8_t *)d;
  d_local = (shared_ptr<create::Data> *)this;
  std::shared_ptr<create::Data>::shared_ptr(&local_38,d);
  Serial::Serial(&this->super_Serial,&local_38,(bool)(local_21 & 1));
  std::shared_ptr<create::Data>::~shared_ptr(&local_38);
  (this->super_Serial)._vptr_Serial = (_func_int **)&PTR_startSensorStream_00201048;
  this->readState = READ_HEADER;
  this->headerByte = *puStack_20;
  return;
}

Assistant:

SerialStream::SerialStream(std::shared_ptr<Data> d, const uint8_t& header, bool install_signal_handler) : Serial(d, install_signal_handler), readState(READ_HEADER), headerByte(header) {
  }